

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O2

void __thiscall
TPZCompElHCurl<pzshape::TPZShapePrism>::InitMaterialData
          (TPZCompElHCurl<pzshape::TPZShapePrism> *this,TPZMaterialData *data)

{
  TPZManVector<int,_27> *connectorders;
  int iVar1;
  TPZGeoEl *this_00;
  TPZGeoNode *pTVar2;
  int i;
  long lVar3;
  long local_78;
  TPZManVector<long,_6> ids;
  
  TPZInterpolationSpace::InitMaterialData((TPZInterpolationSpace *)this,data);
  (data->super_TPZShapeData).fShapeType = EVecShape;
  local_78 = 0;
  TPZManVector<long,_6>::TPZManVector(&ids,6,&local_78);
  this_00 = TPZCompEl::Reference((TPZCompEl *)this);
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    pTVar2 = TPZGeoEl::NodePtr(this_00,(int)lVar3);
    ids.super_TPZVec<long>.fStore[lVar3] = (long)pTVar2->fId;
  }
  connectorders = &(data->super_TPZShapeData).fHDivConnectOrders;
  local_78 = CONCAT44(local_78._4_4_,0xffffffff);
  (*(data->super_TPZShapeData).fHDivConnectOrders.super_TPZVec<int>._vptr_TPZVec[2])
            (connectorders,0xf);
  for (lVar3 = 0; lVar3 != 0xf; lVar3 = lVar3 + 1) {
    iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x338))(this,(int)lVar3 + 6);
    (data->super_TPZShapeData).fHDivConnectOrders.super_TPZVec<int>.fStore[lVar3] = iVar1;
  }
  if (this->fhcurlfam == EHCurlStandard) {
    TPZShapeHCurl<pzshape::TPZShapePrism>::Initialize
              (&ids.super_TPZVec<long>,&connectorders->super_TPZVec<int>,&data->super_TPZShapeData);
  }
  else if (this->fhcurlfam == EHCurlNoGrads) {
    TPZShapeHCurlNoGrads<pzshape::TPZShapePrism>::Initialize
              (&ids.super_TPZVec<long>,&connectorders->super_TPZVec<int>,&data->super_TPZShapeData);
  }
  iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 600))(this);
  (*(data->phi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0xe])(&data->phi,(long)iVar1,3);
  (*(data->curlphi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0xe])(&data->curlphi,3,(long)iVar1);
  TPZFMatrix<double>::Redim(&(data->axes).super_TPZFMatrix<double>,3,3);
  TPZFMatrix<double>::Redim(&(data->jacobian).super_TPZFMatrix<double>,3,3);
  TPZFMatrix<double>::Redim(&(data->jacinv).super_TPZFMatrix<double>,3,3);
  TPZManVector<double,_3>::Resize(&data->x,3);
  TPZManVector<long,_6>::~TPZManVector(&ids);
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::InitMaterialData(TPZMaterialData &data){
	TPZIntelGen<TSHAPE>::InitMaterialData(data);
#ifdef PZ_LOG
    if(logger.isDebugEnabled()){
        LOGPZ_DEBUG(logger,"Initializing MaterialData of TPZCompElHCurl")
    }
#endif
    data.fShapeType = TPZMaterialData::MShapeFunctionType::EVecShape;
    TPZShapeData & shapedata = data;

    TPZManVector<int64_t,TSHAPE::NCornerNodes> ids(TSHAPE::NCornerNodes,0);
    TPZGeoEl *ref = this->Reference();
    for(auto i=0; i<TSHAPE::NCornerNodes; i++) {
        ids[i] = ref->NodePtr(i)->Id();
    }
    
    auto &conOrders = shapedata.fHDivConnectOrders;
    constexpr auto nConnects = TSHAPE::NSides - TSHAPE::NCornerNodes;
    conOrders.Resize(nConnects,-1);
    for(auto i = 0; i < nConnects; i++){
        conOrders[i] = this->EffectiveSideOrder(i + TSHAPE::NCornerNodes);
    }

    switch (fhcurlfam)
    {
    case HCurlFamily::EHCurlStandard:
        TPZShapeHCurl<TSHAPE>::Initialize(ids, conOrders, shapedata);
        break;
    case HCurlFamily::EHCurlNoGrads:
        TPZShapeHCurlNoGrads<TSHAPE>::Initialize(ids, conOrders, shapedata);
        break;
    }/**there is no default case on purpose, because now the compiler
      will warn us if a new hcurl family is added*/
    

    //resizing of TPZMaterialData structures

    constexpr int dim = TSHAPE::Dimension;
    constexpr int curldim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    const int nshape = this->NShapeF();
    
    auto &phi = data.phi;
    auto &curlphi = data.curlphi;
    
    phi.Redim(nshape,3);
    curlphi.Redim(curldim,nshape);
    
    data.axes.Redim(dim,3);
    data.jacobian.Redim(dim,dim);
    data.jacinv.Redim(dim,dim);
    data.x.Resize(3);
// #ifdef PZ_LOG
//     if(logger.isDebugEnabled()){
// 		std::stringstream sout;
// 		sout << "Vector/Shape indexes \n";
//         for (int i = 0; i < shapedata.fVecShapeIndex.size(); i++) {
//             sout << i << '|' << shapedata.fVecShapeIndex[i] << " ";
//         }
//         sout << std::endl;
// 		LOGPZ_DEBUG(logger,sout.str())
// 	}
// #endif

}